

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginElemExpr
          (BinaryReaderIR *this,Index elem_index,Index expr_index)

{
  pointer *ppiVar1;
  pointer ppEVar2;
  ElemSegment *pEVar3;
  iterator __position;
  Result RVar4;
  
  ppEVar2 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3) - 1U != (ulong)elem_index) {
    __assert_fail("elem_index == module_->elem_segments.size() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                  ,0x59b,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemExpr(Index, Index)"
                 );
  }
  pEVar3 = ppEVar2[elem_index];
  __position._M_current =
       *(pointer *)
        ((long)&(pEVar3->elem_exprs).
                super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                ._M_impl + 8);
  if (((long)__position._M_current -
       *(long *)&(pEVar3->elem_exprs).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                 ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555 - (ulong)expr_index ==
      0) {
    if (__position._M_current ==
        *(pointer *)
         ((long)&(pEVar3->elem_exprs).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                 ._M_impl + 0x10)) {
      std::
      vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>::
      _M_realloc_insert<>(&pEVar3->elem_exprs,__position);
    }
    else {
      (__position._M_current)->first_ = (Expr *)0x0;
      (__position._M_current)->last_ = (Expr *)0x0;
      (__position._M_current)->size_ = 0;
      ppiVar1 = (pointer *)
                ((long)&(pEVar3->elem_exprs).
                        super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                        ._M_impl + 8);
      *ppiVar1 = *ppiVar1 + 1;
    }
    RVar4 = PushLabel(this,InitExpr,
                      *(pointer *)
                       ((long)&(pEVar3->elem_exprs).
                               super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                               ._M_impl + 8) + -1,(Expr *)0x0);
    return (Result)RVar4.enum_;
  }
  __assert_fail("expr_index == segment->elem_exprs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x59d,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemExpr(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginElemExpr(Index elem_index, Index expr_index) {
  assert(elem_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[elem_index];
  assert(expr_index == segment->elem_exprs.size());
  segment->elem_exprs.emplace_back();
  return BeginInitExpr(&segment->elem_exprs.back());
}